

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_impl.hpp
# Opt level: O2

void __thiscall Catch::TestRunStats::~TestRunStats(TestRunStats *this)

{
  ~TestRunStats(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

TestRunStats::~TestRunStats() {}